

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O1

Cards * __thiscall
DeckOfCards::draw(Cards *__return_storage_ptr__,DeckOfCards *this,Cards *pickedCard)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pCVar5;
  pointer pcVar6;
  undefined8 uVar7;
  int iVar8;
  bool bVar9;
  pointer pCVar10;
  Cards card;
  int local_dc;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> local_50;
  iterator local_38;
  
  pCVar10 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar5 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar10 != pCVar5) {
    paVar1 = &(__return_storage_ptr__->name).field_2;
    paVar2 = &(pickedCard->name).field_2;
    paVar3 = &(__return_storage_ptr__->description).field_2;
    paVar4 = &(pickedCard->description).field_2;
    local_dc = 0;
    do {
      local_a0._0_4_ = pCVar10->id;
      local_98._M_p = (pointer)&local_88;
      pcVar6 = (pCVar10->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar6,pcVar6 + (pCVar10->name)._M_string_length);
      pcVar6 = (pCVar10->description)._M_dataplus._M_p;
      local_78._M_p = (pointer)&local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar6,pcVar6 + (pCVar10->description)._M_string_length);
      local_58._0_4_ = pCVar10->type;
      local_58._4_4_ = pCVar10->energyCost;
      std::vector<int,_std::allocator<int>_>::vector(&local_50,&pCVar10->effect);
      local_38._M_current = (pCVar10->it)._M_current;
      bVar9 = Cards::operator==((Cards *)local_a0,pickedCard);
      if (bVar9) {
        std::vector<Cards,_std::allocator<Cards>_>::_M_erase
                  (this->deck,
                   (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                   super__Vector_impl_data._M_finish + (-1 - (long)local_dc));
        std::vector<Cards,_std::allocator<Cards>_>::push_back(this->discardedDeck,pickedCard);
        __return_storage_ptr__->id = pickedCard->id;
        (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar1;
        pcVar6 = (pickedCard->name)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 == paVar2) {
          uVar7 = *(undefined8 *)((long)&(pickedCard->name).field_2 + 8);
          paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = uVar7;
        }
        else {
          (__return_storage_ptr__->name)._M_dataplus._M_p = pcVar6;
          (__return_storage_ptr__->name).field_2._M_allocated_capacity =
               paVar2->_M_allocated_capacity;
        }
        (__return_storage_ptr__->name)._M_string_length = (pickedCard->name)._M_string_length;
        (pickedCard->name)._M_dataplus._M_p = (pointer)paVar2;
        (pickedCard->name)._M_string_length = 0;
        (pickedCard->name).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->description)._M_dataplus._M_p = (pointer)paVar3;
        pcVar6 = (pickedCard->description)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 == paVar4) {
          uVar7 = *(undefined8 *)((long)&(pickedCard->description).field_2 + 8);
          paVar3->_M_allocated_capacity = paVar4->_M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->description).field_2 + 8) = uVar7;
        }
        else {
          (__return_storage_ptr__->description)._M_dataplus._M_p = pcVar6;
          (__return_storage_ptr__->description).field_2._M_allocated_capacity =
               paVar4->_M_allocated_capacity;
        }
        (__return_storage_ptr__->description)._M_string_length =
             (pickedCard->description)._M_string_length;
        (pickedCard->description)._M_dataplus._M_p = (pointer)paVar4;
        (pickedCard->description)._M_string_length = 0;
        (pickedCard->description).field_2._M_local_buf[0] = '\0';
        iVar8 = pickedCard->energyCost;
        __return_storage_ptr__->type = pickedCard->type;
        __return_storage_ptr__->energyCost = iVar8;
        (__return_storage_ptr__->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pickedCard->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pickedCard->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pickedCard->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (pickedCard->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pickedCard->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pickedCard->effect).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->it)._M_current = (pickedCard->it)._M_current;
      }
      else {
        local_dc = local_dc + 1;
      }
      if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
    } while ((!bVar9) && (pCVar10 = pCVar10 + 1, pCVar10 != pCVar5));
  }
  return __return_storage_ptr__;
}

Assistant:

Cards DeckOfCards::draw(Cards pickedCard) {
    int index=0;
    for(Cards card : *deck){
        if(card == pickedCard){
        deck->erase(deck->end() - 1 - index);
        discardedDeck->push_back(pickedCard);
        return pickedCard;
        }
        else {
            index++;
        }
    }
}